

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O1

void __thiscall FileReceiveSession::on_input(FileReceiveSession *this,Poll *p)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  ssize_t sVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  path local_a8;
  path local_88;
  path local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  sVar3 = read((this->super_Subscriber).fd,FILE_REC_BUF,10000);
  if ((int)sVar3 < 0) {
    if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
      paVar1 = &local_68.m_pathname.field_2;
      pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
      local_68.m_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
      if ((this->fail).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->fail)._M_invoker)((_Any_data *)&this->fail,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68.m_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_68.m_pathname._M_dataplus._M_p,
                        local_68.m_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    pbVar4 = (basic_ostream<char,_std::char_traits<char>_> *)&std::cout;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Error in reading from socket ",0x1d);
  }
  else {
    if ((int)sVar3 == 0) {
      std::fstream::close();
      if ((this->success).super__Function_base._M_manager != (_Manager_type)0x0) {
        paVar1 = &local_a8.m_pathname.field_2;
        pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
        local_a8.m_pathname._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a8,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
        if ((this->success).super__Function_base._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        (*(this->success)._M_invoker)((_Any_data *)&this->success,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.m_pathname._M_dataplus._M_p != paVar1) {
          operator_delete(local_a8.m_pathname._M_dataplus._M_p,
                          local_a8.m_pathname.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_0013a35b;
    }
    std::ostream::write(&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.
                         field_0x10,0x14ec80);
    if (((&(this->stream).super_basic_fstream<char,_std::char_traits<char>_>.field_0x20)
         [*(long *)(*(long *)&(this->stream).super_basic_fstream<char,_std::char_traits<char>_> +
                   -0x18)] & 5) == 0) {
      return;
    }
    if ((this->fail).super__Function_base._M_manager != (_Manager_type)0x0) {
      paVar1 = &local_88.m_pathname.field_2;
      pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
      local_88.m_pathname._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
      if ((this->fail).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->fail)._M_invoker)((_Any_data *)&this->fail,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88.m_pathname._M_dataplus._M_p != paVar1) {
        operator_delete(local_88.m_pathname._M_dataplus._M_p,
                        local_88.m_pathname.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Could not write to file ",0x18);
    pcVar2 = (this->file).m_pathname._M_dataplus._M_p;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar2,pcVar2 + (this->file).m_pathname._M_string_length);
    pbVar4 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cout,&local_48,'&',
                        '\"');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  std::ios::widen((char)pbVar4->_vptr_basic_ostream[-3] + (char)pbVar4);
  std::ostream::put((char)pbVar4);
  std::ostream::flush();
LAB_0013a35b:
  Poll::unsubscribe(p,&this->super_Subscriber);
  return;
}

Assistant:

void FileReceiveSession::on_input(Poll &p) {
  int bytes = read(fd, FILE_REC_BUF, FILE_REC_BUF_SIZE);
  if (bytes < 0) {
    if (this->fail)
      this->fail(file);
    std::cout << "Error in reading from socket " << std::endl;
    p.unsubscribe(*this);
    return;
  } else if (bytes > 0) {
    stream.write(FILE_REC_BUF, bytes);
    if (!stream) {
      if (this->fail)
        this->fail(file);
      std::cout << "Could not write to file " << file << std::endl;
      p.unsubscribe(*this);
    }
  } else {
    stream.close();
    if (this->success)
      success(file);
    p.unsubscribe(*this);
  }
}